

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRingBuffer.hpp
# Opt level: O2

void __thiscall de::RingBuffer<unsigned_char>::resize(RingBuffer<unsigned_char> *this,int newSize)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *_tmp_;
  ulong uVar6;
  ulong uVar7;
  
  puVar5 = (uchar *)operator_new__((long)newSize);
  uVar1 = this->m_numElements;
  iVar2 = this->m_back;
  puVar4 = this->m_buffer;
  iVar3 = this->m_size;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    puVar5[uVar6] = puVar4[(iVar2 + (int)uVar6) % iVar3];
  }
  this->m_front = uVar1;
  this->m_back = 0;
  this->m_size = newSize;
  this->m_buffer = puVar5;
  if (puVar4 != (uchar *)0x0) {
    operator_delete__(puVar4);
    return;
  }
  return;
}

Assistant:

void RingBuffer<T>::resize (int newSize)
{
	DE_ASSERT(newSize >= m_numElements);
	T* buf = new T[newSize];

	try
	{
		// Copy old elements.
		for (int ndx = 0; ndx < m_numElements; ndx++)
			buf[ndx] = m_buffer[(m_back + ndx) % m_size];

		// Reset pointers.
		m_front		= m_numElements;
		m_back		= 0;
		m_size		= newSize;

		DE_SWAP(T*, buf, m_buffer);
		delete[] buf;
	}
	catch (...)
	{
		delete[] buf;
		throw;
	}
}